

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

bool cmLibDirsLinked(string *l,string *r)

{
  bool bVar1;
  int iVar2;
  string local_50;
  string local_30;
  
  bVar1 = cmsys::SystemTools::FileIsSymlink(l);
  if ((!bVar1) && (bVar1 = cmsys::SystemTools::FileIsSymlink(r), !bVar1)) {
    return false;
  }
  cmsys::SystemTools::GetRealPath(&local_50,l,(string *)0x0);
  cmsys::SystemTools::GetRealPath(&local_30,r,(string *)0x0);
  if (local_50._M_string_length == local_30._M_string_length) {
    if (local_50._M_string_length == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = bcmp(local_50._M_dataplus._M_p,local_30._M_dataplus._M_p,local_50._M_string_length);
      bVar1 = iVar2 == 0;
    }
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool cmLibDirsLinked(std::string const& l, std::string const& r)
{
  // Compare the real paths of the two directories.
  // Since our caller only changed the trailing component of each
  // directory, the real paths can be the same only if at least one of
  // the trailing components is a symlink.  Use this as an optimization
  // to avoid excessive realpath calls.
  return (cmSystemTools::FileIsSymlink(l) ||
          cmSystemTools::FileIsSymlink(r)) &&
    cmSystemTools::GetRealPath(l) == cmSystemTools::GetRealPath(r);
}